

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O1

char * helicsQueryExecuteComplete(HelicsQuery query,HelicsError *err)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  char *pcVar1;
  HelicsQuery pvVar2;
  bool bVar3;
  QueryId local_34;
  string local_30;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (query == (HelicsQuery)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_0019b8ab;
    }
    else {
      bVar3 = *(int *)((long)query + 0x7c) == 0x27063885;
      pvVar2 = (HelicsQuery)0x0;
      if (bVar3) {
        pvVar2 = query;
      }
      if (bVar3 || err == (HelicsError *)0x0) goto LAB_0019b8ae;
    }
    err->error_code = -3;
    err->message = "Query object is invalid";
  }
LAB_0019b8ab:
  pvVar2 = (HelicsQuery)0x0;
LAB_0019b8ae:
  if (pvVar2 == (HelicsQuery)0x0) {
    pcVar1 = 
    "{{\n  \"error\":{{\n    \"code\":400,\n    \"message\":\"query object is not valid\"\n  }}\n}}"
    ;
  }
  else {
    if (*(uint *)((long)pvVar2 + 0x78) != 0xffffffff) {
      local_34.ivalue = *(uint *)((long)pvVar2 + 0x78);
      helics::Federate::queryComplete_abi_cxx11_
                (&local_30,*(Federate **)((long)pvVar2 + 0x60),&local_34);
      helicsQueryExecuteComplete_cold_1();
    }
    *(undefined1 *)((long)pvVar2 + 0x70) = 0;
    this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pvVar2 + 0x68);
    *(undefined8 *)((long)pvVar2 + 0x60) = 0;
    *(undefined8 *)((long)pvVar2 + 0x68) = 0;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    *(undefined4 *)((long)pvVar2 + 0x78) = 0xffffffff;
    pcVar1 = *(char **)((long)pvVar2 + 0x40);
  }
  return pcVar1;
}

Assistant:

const char* helicsQueryExecuteComplete(HelicsQuery query, HelicsError* err)
{
    auto* queryObj = getQueryObj(query, err);
    if (queryObj == nullptr) {
        return invalidQueryObConst;
    }
    try {
        if (queryObj->asyncIndexCode.isValid()) {
            queryObj->response = queryObj->activeFed->queryComplete(queryObj->asyncIndexCode);
        }
        queryObj->activeAsync = false;
        queryObj->activeFed = nullptr;
        queryObj->asyncIndexCode = helics::QueryId();
        return queryObj->response.c_str();
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    return queryErrorString;
    // LCOV_EXCL_STOP
}